

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftutil.c
# Opt level: O3

void FT_List_Insert(FT_List list,FT_ListNode node)

{
  FT_ListNode pFVar1;
  FT_ListNode pFVar2;
  
  if (node != (FT_ListNode)0x0 && list != (FT_List)0x0) {
    pFVar1 = list->head;
    node->next = pFVar1;
    node->prev = (FT_ListNode)0x0;
    pFVar2 = (FT_ListNode)&list->tail;
    if (pFVar1 != (FT_ListNode)0x0) {
      pFVar2 = pFVar1;
    }
    pFVar2->prev = node;
    list->head = node;
  }
  return;
}

Assistant:

FT_EXPORT_DEF( void )
  FT_List_Insert( FT_List      list,
                  FT_ListNode  node )
  {
    FT_ListNode  after;


    if ( !list || !node )
      return;

    after = list->head;

    node->next = after;
    node->prev = NULL;

    if ( !after )
      list->tail = node;
    else
      after->prev = node;

    list->head = node;
  }